

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O1

void QtPrivate::QDebugStreamOperatorForType<Qt::Orientation,_true>::debugStream
               (QMetaTypeInterface *param_1,QDebug *dbg,void *a)

{
  int iVar1;
  uint uVar2;
  long in_FS_OFFSET;
  QDebug local_38;
  QDebug local_30;
  QDebug local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = (QDebug)dbg->stream;
  iVar1 = *(int *)(local_38.stream + 0x28);
  *(int *)(local_38.stream + 0x28) = iVar1 + 1;
  uVar2 = *a;
  *(int *)(local_38.stream + 0x28) = iVar1 + 2;
  local_28.stream = local_38.stream;
  qt_QMetaEnum_flagDebugOperator
            (&local_30,(ulonglong)&local_28,(QMetaObject *)(ulong)uVar2,
             (char *)&Qt::staticMetaObject);
  QDebug::~QDebug(&local_28);
  QDebug::~QDebug(&local_30);
  QDebug::~QDebug(&local_38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

static void debugStream(const QMetaTypeInterface *, QDebug &dbg, const void *a)
    { dbg << *reinterpret_cast<const T *>(a); }